

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O3

uint32_t helper_uadd16_aarch64(uint32_t a,uint32_t b,void *gep)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = (b & 0xffff) + (a & 0xffff);
  uVar1 = (b >> 0x10) + (a >> 0x10);
  iVar2 = (uint)(0xffff < uVar3) * 3 + 0xc;
  if (uVar1 < 0x10000) {
    iVar2 = (uint)(0xffff < uVar3) * 3;
  }
  *(int *)gep = iVar2;
  return uVar1 * 0x10000 | uVar3 & 0xffff;
}

Assistant:

uint32_t HELPER(glue(PFX,add16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b, 0);
    ADD16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}